

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O2

void __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstructCondense<std::complex<double>_>_>::ComputeV1
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstructCondense<std::complex<double>_>_>
           *this,TPZFMatrix<std::complex<double>_> *x,TPZFMatrix<std::complex<double>_> *v1)

{
  list<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
  *plVar1;
  int iVar2;
  _List_node_base *p_Var3;
  TPZFMatrix<std::complex<double>_> CoarseSolution;
  TPZFMatrix<std::complex<double>_> CoarseResidual;
  TPZFMatrix<std::complex<double>_> CoarseResidual_local;
  TPZFMatrix<std::complex<double>_> CoarseSolution_local;
  
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (&CoarseResidual,this->fNumCoarse,
             (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol);
  iVar2 = 0;
  memset(CoarseResidual.fElem,0,
         CoarseResidual.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
         CoarseResidual.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol * 0x10);
  CoarseResidual.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  plVar1 = &this->fGlobal;
  p_Var3 = (_List_node_base *)plVar1;
  while (p_Var3 = (((_List_base<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)plVar1) {
    TPZFMatrix<std::complex<double>_>::TPZFMatrix(&CoarseSolution);
    TPZFMatrix<std::complex<double>_>::TPZFMatrix(&CoarseResidual_local);
    TPZDohrAssembly<std::complex<double>_>::Extract
              (((this->fAssemble).fRef)->fPointer,iVar2,x,&CoarseSolution);
    TPZDohrSubstructCondense<std::complex<double>_>::Contribute_rc_local
              (*(TPZDohrSubstructCondense<std::complex<double>_> **)p_Var3[1]._M_next,
               &CoarseSolution,&CoarseResidual_local);
    TPZDohrAssembly<std::complex<double>_>::AssembleCoarse
              (((this->fAssemble).fRef)->fPointer,iVar2,&CoarseResidual_local,&CoarseResidual);
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&CoarseResidual_local);
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&CoarseSolution);
    iVar2 = iVar2 + 1;
  }
  TPZStepSolver<std::complex<double>_>::SetDirect(this->fCoarse,ELDLt);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (&CoarseSolution,this->fNumCoarse,
             (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol);
  iVar2 = 0;
  (*(this->fCoarse->super_TPZMatrixSolver<std::complex<double>_>).super_TPZSolver.super_TPZSavable.
    _vptr_TPZSavable[0xb])(this->fCoarse,&CoarseResidual,&CoarseSolution,0);
  p_Var3 = (_List_node_base *)plVar1;
  while (p_Var3 = (((_List_base<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)plVar1) {
    TPZFMatrix<std::complex<double>_>::TPZFMatrix(&CoarseResidual_local);
    TPZFMatrix<std::complex<double>_>::TPZFMatrix(&CoarseSolution_local);
    TPZDohrAssembly<std::complex<double>_>::ExtractCoarse
              (((this->fAssemble).fRef)->fPointer,iVar2,&CoarseSolution,&CoarseSolution_local);
    TPZDohrSubstructCondense<std::complex<double>_>::Contribute_v1_local
              (*(TPZDohrSubstructCondense<std::complex<double>_> **)p_Var3[1]._M_next,
               &CoarseResidual_local,&CoarseSolution_local);
    TPZDohrAssembly<std::complex<double>_>::Assemble
              (((this->fAssemble).fRef)->fPointer,iVar2,&CoarseResidual_local,v1);
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&CoarseSolution_local);
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&CoarseResidual_local);
    iVar2 = iVar2 + 1;
  }
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&CoarseSolution);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&CoarseResidual);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV1(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v1) const
{
	/* Computing r(c) */
	TPZFMatrix<TVar> CoarseResidual(fNumCoarse,x.Cols());
	CoarseResidual.Zero();
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub = 0;
	for(it= fGlobal.begin(); it != fGlobal.end(); it++, isub++) {
		TPZFMatrix<TVar> xloc, CoarseResidual_local;
		fAssemble->Extract(isub,x,xloc);
		//		(*it)->LoadWeightedResidual(xloc);
		(*it)->Contribute_rc_local(xloc,CoarseResidual_local);
		fAssemble->AssembleCoarse(isub,CoarseResidual_local,CoarseResidual);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		CoarseResidual.Print("Coarse Residual",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	/* Computing K(c)_inverted*r(c) and stores it in "product" */
	fCoarse->SetDirect(ELDLt);
	//Dado global
	TPZFMatrix<TVar> CoarseSolution(fNumCoarse,x.Cols());
	fCoarse->Solve(CoarseResidual,CoarseSolution);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		CoarseSolution.Print("CoarseSolution",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// Gerenciamento Global->Local sobre o product
		//product é administrado pelo DM mas permanece no processador 0
		// tarefa separada, expansao da solucao coarse
		TPZFMatrix<TVar> v1_local,CoarseSolution_local;
		fAssemble->ExtractCoarse(isub,CoarseSolution,CoarseSolution_local);
		(*it)->Contribute_v1_local(v1_local,CoarseSolution_local);
		
		fAssemble->Assemble(isub,v1_local,v1);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v1.Print("v1 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}